

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsysinfo.cpp
# Opt level: O2

QByteArray * getEtcFileContent(QByteArray *__return_storage_ptr__,char *filename)

{
  int __fd;
  int iVar1;
  char *data;
  qint64 size;
  mode_t in_EDX;
  long in_FS_OFFSET;
  stat64 sbuf;
  stat64 local_b0;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  __fd = qt_safe_open(filename,(int)filename,in_EDX);
  if (__fd != -1) {
    memset(&local_b0,0xaa,0x90);
    iVar1 = fstat64(__fd,&local_b0);
    if (iVar1 != -1) {
      (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
      QByteArray::QByteArray(__return_storage_ptr__,local_b0.st_size,Uninitialized);
      data = QByteArray::data(__return_storage_ptr__);
      size = qt_safe_read(__fd,data,local_b0.st_size);
      QByteArray::resize(__return_storage_ptr__,size);
      qt_safe_close(__fd);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        return __return_storage_ptr__;
      }
      goto LAB_00206f05;
    }
    qt_safe_close(__fd);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
LAB_00206f05:
  __stack_chk_fail();
}

Assistant:

static QByteArray getEtcFileContent(const char *filename)
{
    // we're avoiding QFile here
    int fd = qt_safe_open(filename, O_RDONLY);
    if (fd == -1)
        return QByteArray();

    QT_STATBUF sbuf;
    if (QT_FSTAT(fd, &sbuf) == -1) {
        qt_safe_close(fd);
        return QByteArray();
    }

    QByteArray buffer(sbuf.st_size, Qt::Uninitialized);
    buffer.resize(qt_safe_read(fd, buffer.data(), sbuf.st_size));
    qt_safe_close(fd);
    return buffer;
}